

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

void PatchDistanceCodesForBuggyDecoders(uint *d_lengths)

{
  int i;
  int num_dist_codes;
  uint *d_lengths_local;
  
  num_dist_codes = 0;
  i = 0;
  while( true ) {
    if (0x1d < i) {
      if (num_dist_codes == 0) {
        d_lengths[1] = 1;
        *d_lengths = 1;
      }
      else if (num_dist_codes == 1) {
        d_lengths[(int)(uint)(*d_lengths != 0)] = 1;
      }
      return;
    }
    if (d_lengths[i] != 0) {
      num_dist_codes = num_dist_codes + 1;
    }
    if (1 < num_dist_codes) break;
    i = i + 1;
  }
  return;
}

Assistant:

static void PatchDistanceCodesForBuggyDecoders(unsigned* d_lengths) {
  int num_dist_codes = 0; /* Amount of non-zero distance codes */
  int i;
  for (i = 0; i < 30 /* Ignore the two unused codes from the spec */; i++) {
    if (d_lengths[i]) num_dist_codes++;
    if (num_dist_codes >= 2) return; /* Two or more codes is fine. */
  }

  if (num_dist_codes == 0) {
    d_lengths[0] = d_lengths[1] = 1;
  } else if (num_dist_codes == 1) {
    d_lengths[d_lengths[0] ? 1 : 0] = 1;
  }
}